

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O0

string * Diligent::UnrollShaderIncludesImpl
                   (string *__return_storage_ptr__,ShaderCreateInfo ShaderCI,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *AllIncludes)

{
  Char *pBuffer;
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 aVar1;
  type local_290;
  anon_class_32_4_8e7c8b92 local_1f0;
  size_t local_1d0;
  size_t PrevIncludeEnd;
  stringstream local_1b8 [8];
  stringstream Stream;
  char local_1a8 [376];
  undefined1 local_30 [8];
  ShaderSourceFileData SourceData;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *AllIncludes_local;
  
  SourceData._16_8_ = AllIncludes;
  ReadShaderSourceFile((ShaderSourceFileData *)local_30,&ShaderCI);
  ShaderCI.Source = (Char *)SourceData.pFileData.m_pObject;
  aVar1.SourceLength._4_4_ = 0;
  aVar1.SourceLength._0_4_ = (uint)SourceData.Source;
  ShaderCI.field_4 = aVar1;
  ShaderCI.FilePath = (Char *)0x0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1d0 = 0;
  pBuffer = ShaderCI.Source;
  aVar1.SourceLength = ShaderCI.field_4.SourceLength;
  local_1f0.Stream = (stringstream *)local_1b8;
  local_1f0.PrevIncludeEnd = &local_1d0;
  local_1f0.AllIncludes =
       (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)SourceData._16_8_;
  local_1f0.ShaderCI = &ShaderCI;
  std::
  bind<void(&)(Diligent::ShaderCreateInfo_const&,std::__cxx11::string_const&),Diligent::ShaderCreateInfo&,std::_Placeholder<1>const&>
            (&local_290,ProcessIncludeErrorHandler,&ShaderCI,
             (_Placeholder<1> *)&std::placeholders::_1);
  FindIncludes<Diligent::UnrollShaderIncludesImpl(Diligent::ShaderCreateInfo,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&)::__0,std::_Bind<void(*(Diligent::ShaderCreateInfo,std::_Placeholder<1>))(Diligent::ShaderCreateInfo_const&,std::__cxx11::string_const&)>>
            (pBuffer,aVar1.SourceLength,&local_1f0,&local_290);
  std::ostream::write(local_1a8,(long)(ShaderCI.Source + local_1d0));
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  ShaderSourceFileData::~ShaderSourceFileData((ShaderSourceFileData *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string UnrollShaderIncludesImpl(ShaderCreateInfo ShaderCI, std::unordered_set<std::string>& AllIncludes) noexcept(false)
{
    const auto SourceData = ReadShaderSourceFile(ShaderCI);

    ShaderCI.Source       = SourceData.Source;
    ShaderCI.SourceLength = SourceData.SourceLength;
    ShaderCI.FilePath     = nullptr;

    std::stringstream Stream;
    size_t            PrevIncludeEnd = 0;

    FindIncludes(
        ShaderCI.Source, ShaderCI.SourceLength, [&](const std::string& Path, size_t IncludeStart, size_t IncludeEnd) {
            // Insert text before the include start
            Stream.write(ShaderCI.Source + PrevIncludeEnd, IncludeStart - PrevIncludeEnd);

            if (AllIncludes.insert(Path).second)
            {
                // Process the #include directive
                ShaderCreateInfo IncludeCI{ShaderCI};
                IncludeCI.Source       = nullptr;
                IncludeCI.SourceLength = 0;
                IncludeCI.FilePath     = Path.c_str();
                auto UnrolledInclude   = UnrollShaderIncludesImpl(IncludeCI, AllIncludes);
                Stream << UnrolledInclude;
            }

            PrevIncludeEnd = IncludeEnd;
        },
        std::bind(ProcessIncludeErrorHandler, ShaderCI, std::placeholders::_1));

    // Insert text after the last include
    Stream.write(ShaderCI.Source + PrevIncludeEnd, ShaderCI.SourceLength - PrevIncludeEnd);

    return Stream.str();
}